

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O2

vrna_param_t * get_scaled_params(vrna_md_t *md)

{
  int iVar1;
  vrna_param_t *pvVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  int (*paiVar6) [8];
  int (*paaiVar7) [5] [5];
  int (*paiVar8) [5];
  int (*paaaiVar9) [8] [5] [5];
  int (*paaaaaiVar10) [8] [5] [5] [5] [5];
  int (*paiVar11) [8];
  int (*paaiVar12) [5] [5];
  int (*paiVar13) [5];
  int (*paaaiVar14) [8] [5] [5];
  int (*paaaaiVar15) [8] [5] [5] [5];
  int (*paaaaaiVar16) [8] [5] [5] [5] [5];
  int (*paiVar17) [8];
  int (*paaiVar18) [5] [5];
  int (*paiVar19) [5];
  int (*paaaiVar20) [8] [5] [5];
  int (*paaaaiVar21) [8] [5] [5] [5];
  uint uVar22;
  int *piVar23;
  int (*paaiVar24) [5] [5];
  vrna_param_t *pvVar25;
  int (*paaaiVar26) [8] [5] [5];
  ulong uVar27;
  long lVar28;
  int (*paaaaiVar29) [8] [5] [5] [5];
  int (*paaiVar30) [5] [5];
  int (*paiVar31) [5];
  long lVar32;
  long lVar33;
  int (*paaiVar34) [5] [5];
  int (*paiVar35) [5];
  long lVar36;
  int m_1;
  int (*paaiVar37) [5] [5];
  int (*paiVar38) [5];
  int (*paaaiVar39) [8] [5] [5];
  int (*paaiVar40) [5] [5];
  int (*paiVar41) [5];
  int (*paaaaiVar42) [8] [5] [5] [5];
  int (*paaaaiVar43) [8] [5] [5] [5];
  int (*paaiVar44) [5] [5];
  int (*paiVar45) [5];
  int (*paaaaaiVar46) [8] [5] [5] [5] [5];
  int (*paaiVar47) [5] [5];
  int (*paiVar48) [5];
  int (*paaiVar49) [5] [5];
  int (*paiVar50) [5];
  int (*paaaaiVar51) [5] [5] [5] [5];
  long lVar52;
  int (*paaaaiVar53) [5] [5] [5] [5];
  int (*paaaaiVar54) [8] [5] [5] [5];
  int (*paaiVar55) [5] [5];
  int (*paiVar56) [5];
  int (*paaaaaiVar57) [8] [5] [5] [5] [5];
  double dVar58;
  int iVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  int (*local_c8) [5];
  int (*local_a8) [5];
  int (*local_a0) [5];
  int (*local_98) [8] [5] [5] [5] [5];
  vrna_param_t *local_90;
  
  pvVar2 = (vrna_param_t *)vrna_alloc(0x33ea8);
  memset(pvVar2->param_file,0,0x100);
  pcVar3 = last_parameter_file();
  if (pcVar3 != (char *)0x0) {
    pcVar3 = last_parameter_file();
    strncpy(pvVar2->param_file,pcVar3,0xff);
  }
  memcpy(&pvVar2->model_details,md,0x7e8);
  dVar61 = md->temperature;
  pvVar2->temperature = dVar61;
  dVar62 = (dVar61 + 273.15) / Tmeasure;
  pvVar2->ninio[2] = (int)((double)niniodH - (double)(niniodH - ninio37) * dVar62);
  pvVar2->lxc = lxc37 * dVar62;
  dVar61 = (double)MultipleCAdH;
  iVar59 = MultipleCAdH - MultipleCA37;
  pvVar2->TripleC = (int)((double)TripleCdH - (double)(TripleCdH - TripleC37) * dVar62);
  pvVar2->MultipleCA = (int)(dVar61 - (double)iVar59 * dVar62);
  pvVar2->MultipleCB = (int)((double)MultipleCBdH - (double)(MultipleCBdH - MultipleCB37) * dVar62);
  dVar61 = (double)DuplexInitdH;
  iVar59 = DuplexInitdH - DuplexInit37;
  pvVar2->TerminalAU = (int)((double)TerminalAUdH - (double)(TerminalAUdH - TerminalAU37) * dVar62);
  pvVar2->DuplexInit = (int)(dVar61 - (double)iVar59 * dVar62);
  pvVar2->MLbase = (int)((double)ML_BASEdH - (double)(ML_BASEdH - ML_BASE37) * dVar62);
  pvVar2->PS_penalty = -0x8a;
  pvVar2->PSM_penalty = 0x3ef;
  pvVar2->PSP_penalty = 0x5dc;
  pvVar2->PB_penalty = 0xf6;
  pvVar2->PUP_penalty = 6;
  pvVar2->PPS_penalty = 0x60;
  pvVar2->e_stP_penalty = 0.89;
  pvVar2->e_intP_penalty = 0.74;
  pvVar2->ap_penalty = 0x155;
  pvVar2->bp_penalty = 0x38;
  pvVar2->cp_penalty = 0xc;
  pvVar2->a_penalty = 0x153;
  pvVar2->b_penalty = 3;
  pvVar2->c_penalty = 2;
  pvVar2->MLclosing = (int)((double)ML_closingdH - (double)(ML_closingdH - ML_closing37) * dVar62);
  pvVar2->gquadLayerMismatch =
       (int)((double)GQuadLayerMismatchH -
            (double)(GQuadLayerMismatchH - GQuadLayerMismatch37) * dVar62);
  pvVar2->gquadLayerMismatchMax = GQuadLayerMismatchMax;
  piVar23 = pvVar2->gquad[2] + 3;
  for (lVar4 = 2; lVar4 != 8; lVar4 = lVar4 + 1) {
    uVar27 = 0;
    while (uVar27 != 0x2b) {
      dVar61 = (double)GQuadAlphadH;
      iVar59 = GQuadAlphadH - GQuadAlpha37;
      dVar60 = (double)GQuadBetadH;
      iVar1 = GQuadBetadH - GQuadBeta37;
      dVar58 = log((double)(uVar27 + 1 & 0xffffffff));
      piVar23[uVar27] =
           (int)(dVar58 * (dVar60 - (double)iVar1 * dVar62)) +
           (int)(dVar61 - (double)iVar59 * dVar62) * ((int)lVar4 + -1);
      uVar27 = uVar27 + 1;
    }
    piVar23 = piVar23 + 0x2e;
  }
  for (lVar4 = 0; lVar4 != 0x1f; lVar4 = lVar4 + 1) {
    pvVar2->hairpin[lVar4] =
         (int)((double)hairpindH[lVar4] - (double)(hairpindH[lVar4] - hairpin37[lVar4]) * dVar62);
  }
  for (lVar4 = 0; lVar4 != 0x7c; lVar4 = lVar4 + 4) {
    *(int *)((long)pvVar2->bulge + lVar4) =
         (int)((double)*(int *)((long)bulgedH + lVar4) -
              (double)(*(int *)((long)bulgedH + lVar4) - *(int *)((long)bulge37 + lVar4)) * dVar62);
    *(int *)((long)pvVar2->internal_loop + lVar4) =
         (int)((double)*(int *)((long)internal_loopdH + lVar4) -
              (double)(*(int *)((long)internal_loopdH + lVar4) -
                      *(int *)((long)internal_loop37 + lVar4)) * dVar62);
  }
  uVar22 = 0;
  uVar27 = 0;
  while( true ) {
    sVar5 = strlen(Tetraloops);
    if (sVar5 <= uVar22) break;
    pvVar2->Tetraloop_E[uVar27] =
         (int)((double)TetraloopdH[uVar27] -
              (double)(TetraloopdH[uVar27] - Tetraloop37[uVar27]) * dVar62);
    uVar27 = (ulong)((int)uVar27 + 1);
    uVar22 = uVar22 + 7;
  }
  uVar22 = 0;
  uVar27 = 0;
  while( true ) {
    sVar5 = strlen(Triloops);
    if (sVar5 <= uVar22) break;
    pvVar2->Triloop_E[uVar27] =
         (int)((double)TriloopdH[uVar27] - (double)(TriloopdH[uVar27] - Triloop37[uVar27]) * dVar62)
    ;
    uVar27 = (ulong)((int)uVar27 + 1);
    uVar22 = uVar22 + 5;
  }
  uVar22 = 0;
  uVar27 = 0;
  while( true ) {
    sVar5 = strlen(Hexaloops);
    if (sVar5 <= uVar22) break;
    pvVar2->Hexaloop_E[uVar27] =
         (int)((double)HexaloopdH[uVar27] -
              (double)(HexaloopdH[uVar27] - Hexaloop37[uVar27]) * dVar62);
    uVar27 = (ulong)((int)uVar27 + 1);
    uVar22 = uVar22 + 9;
  }
  for (lVar4 = 0xc767; lVar4 != 0xc76f; lVar4 = lVar4 + 1) {
    *(int *)((long)(pvVar2->stack + -1) + 0x1c + lVar4 * 4) =
         (int)((double)ML_interndH - (double)(ML_interndH - ML_intern37) * dVar62);
  }
  paiVar6 = pvVar2->stack;
  paiVar11 = stackdH;
  paiVar17 = stack37;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    for (lVar33 = 0; lVar33 != 8; lVar33 = lVar33 + 1) {
      (*paiVar6)[lVar33] =
           (int)((double)(*paiVar11)[lVar33] -
                (double)((*paiVar11)[lVar33] - (*paiVar17)[lVar33]) * dVar62);
    }
    paiVar11 = paiVar11 + 1;
    paiVar17 = paiVar17 + 1;
    paiVar6 = paiVar6 + 1;
  }
  paaiVar7 = mismatchIdH;
  paaiVar12 = mismatchI37;
  paaiVar18 = mismatchHdH;
  paaiVar30 = mismatchH37;
  paaiVar34 = mismatch1nIdH;
  paaiVar37 = mismatch1nI37;
  paaiVar40 = mismatch23IdH;
  paaiVar44 = mismatch23I37;
  paaiVar47 = mismatchMdH;
  paaiVar55 = mismatchM37;
  paaiVar49 = mismatchExtdH;
  paaiVar24 = mismatchExt37;
  local_90 = pvVar2;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    lVar33 = 0;
    paiVar8 = *paaiVar7;
    paiVar13 = *paaiVar12;
    paiVar19 = *paaiVar18;
    pvVar25 = local_90;
    paiVar31 = *paaiVar30;
    paiVar35 = *paaiVar34;
    paiVar38 = *paaiVar37;
    paiVar41 = *paaiVar40;
    paiVar45 = *paaiVar44;
    paiVar48 = *paaiVar47;
    paiVar50 = *paaiVar49;
    paiVar56 = *paaiVar55;
    local_c8 = *paaiVar24;
    for (; lVar33 != 5; lVar33 = lVar33 + 1) {
      for (lVar28 = 0; lVar28 != 0x14; lVar28 = lVar28 + 4) {
        iVar59 = *(int *)((long)*(int (*) [5])*paiVar8 + lVar28);
        *(int *)((long)pvVar25->mismatchI[0][0] + lVar28) =
             (int)((double)iVar59 -
                  (double)(iVar59 - *(int *)((long)*(int (*) [5])*paiVar13 + lVar28)) * dVar62);
        iVar59 = *(int *)((long)*(int (*) [5])*paiVar19 + lVar28);
        *(int *)((long)pvVar25->mismatchH[0][0] + lVar28) =
             (int)((double)iVar59 -
                  (double)(iVar59 - *(int *)((long)*(int (*) [5])*paiVar31 + lVar28)) * dVar62);
        iVar59 = *(int *)((long)*(int (*) [5])*paiVar35 + lVar28);
        *(int *)((long)pvVar25->mismatch1nI[0][0] + lVar28) =
             (int)((double)iVar59 -
                  (double)(iVar59 - *(int *)((long)*(int (*) [5])*paiVar38 + lVar28)) * dVar62);
        iVar59 = *(int *)((long)*(int (*) [5])*paiVar41 + lVar28);
        *(int *)((long)pvVar25->mismatch23I[0][0] + lVar28) =
             (int)((double)iVar59 -
                  (double)(iVar59 - *(int *)((long)*(int (*) [5])*paiVar45 + lVar28)) * dVar62);
        if (md->dangles == 0) {
          *(undefined4 *)((long)pvVar25->mismatchExt[0][0] + lVar28) = 0;
          uVar22 = 0;
          lVar52 = 0x1218;
        }
        else {
          iVar59 = *(int *)((long)*(int (*) [5])*paiVar48 + lVar28);
          uVar22 = (uint)((double)iVar59 -
                         (double)(iVar59 - *(int *)((long)*(int (*) [5])*paiVar56 + lVar28)) *
                         dVar62);
          *(uint *)((long)pvVar25->mismatchM[0][0] + lVar28) = (int)uVar22 >> 0x1f & uVar22;
          iVar59 = *(int *)((long)*(int (*) [5])*paiVar50 + lVar28);
          uVar22 = (uint)((double)iVar59 -
                         (double)(iVar59 - *(int *)((long)*(int (*) [5])*local_c8 + lVar28)) *
                         dVar62);
          uVar22 = (int)uVar22 >> 0x1f & uVar22;
          lVar52 = 0x278;
        }
        *(uint *)((long)(pvVar25->stack + -1) + 0x1c + lVar28 + lVar52) = uVar22;
      }
      pvVar25 = (vrna_param_t *)(pvVar25->stack[0] + 4);
      paiVar8 = paiVar8 + 1;
      paiVar13 = paiVar13 + 1;
      paiVar19 = paiVar19 + 1;
      paiVar31 = paiVar31 + 1;
      paiVar35 = paiVar35 + 1;
      paiVar38 = paiVar38 + 1;
      paiVar41 = paiVar41 + 1;
      paiVar45 = paiVar45 + 1;
      paiVar48 = paiVar48 + 1;
      paiVar56 = paiVar56 + 1;
      paiVar50 = paiVar50 + 1;
      local_c8 = local_c8 + 1;
    }
    local_90 = (vrna_param_t *)(local_90->stack + 3);
    paaiVar7 = (int (*) [5] [5])((long)paaiVar7 + 100);
    paaiVar12 = (int (*) [5] [5])((long)paaiVar12 + 100);
    paaiVar18 = (int (*) [5] [5])((long)paaiVar18 + 100);
    paaiVar30 = (int (*) [5] [5])((long)paaiVar30 + 100);
    paaiVar34 = (int (*) [5] [5])((long)paaiVar34 + 100);
    paaiVar37 = (int (*) [5] [5])((long)paaiVar37 + 100);
    paaiVar40 = (int (*) [5] [5])((long)paaiVar40 + 100);
    paaiVar44 = (int (*) [5] [5])((long)paaiVar44 + 100);
    paaiVar47 = (int (*) [5] [5])((long)paaiVar47 + 100);
    paaiVar55 = (int (*) [5] [5])((long)paaiVar55 + 100);
    paaiVar49 = (int (*) [5] [5])((long)paaiVar49 + 100);
    paaiVar24 = (int (*) [5] [5])((long)paaiVar24 + 100);
  }
  paiVar8 = pvVar2->dangle5;
  paiVar13 = dangle5_dH;
  paiVar19 = dangle5_37;
  paiVar31 = dangle3_dH;
  paiVar35 = dangle3_37;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    for (lVar33 = 0; lVar33 != 0x14; lVar33 = lVar33 + 4) {
      iVar59 = *(int *)((long)*paiVar13 + lVar33);
      uVar22 = (uint)((double)iVar59 -
                     (double)(iVar59 - *(int *)((long)*paiVar19 + lVar33)) * dVar62);
      *(uint *)((long)*paiVar8 + lVar33) = (int)uVar22 >> 0x1f & uVar22;
      iVar59 = *(int *)((long)*paiVar31 + lVar33);
      uVar22 = (uint)((double)iVar59 -
                     (double)(iVar59 - *(int *)((long)*paiVar35 + lVar33)) * dVar62);
      *(uint *)((long)paiVar8[8] + lVar33) = (int)uVar22 >> 0x1f & uVar22;
    }
    paiVar13 = paiVar13 + 1;
    paiVar19 = paiVar19 + 1;
    paiVar8 = paiVar8 + 1;
    paiVar31 = paiVar31 + 1;
    paiVar35 = paiVar35 + 1;
  }
  paaaiVar9 = pvVar2->int11;
  paaaiVar14 = int11_dH;
  paaaiVar20 = int11_37;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    paaaiVar39 = paaaiVar9;
    paiVar8 = (int (*) [5])paaaiVar20;
    paiVar13 = (int (*) [5])paaaiVar14;
    for (lVar33 = 0; lVar33 != 8; lVar33 = lVar33 + 1) {
      paaaiVar26 = paaaiVar39;
      paiVar31 = paiVar8;
      paiVar19 = paiVar13;
      for (lVar28 = 0; lVar28 != 5; lVar28 = lVar28 + 1) {
        for (lVar52 = 0; lVar52 != 5; lVar52 = lVar52 + 1) {
          iVar59 = (*(int (*) [5] [5])*paiVar19)[0][lVar52];
          (*paaaiVar26)[0][0][lVar52] =
               (int)((double)iVar59 -
                    (double)(iVar59 - (*(int (*) [5] [5])*paiVar31)[0][lVar52]) * dVar62);
        }
        paiVar19 = paiVar19 + 1;
        paiVar31 = paiVar31 + 1;
        paaaiVar26 = (int (*) [8] [5] [5])((*paaaiVar26)[0] + 1);
      }
      paiVar13 = paiVar13 + 5;
      paiVar8 = paiVar8 + 5;
      paaaiVar39 = (int (*) [8] [5] [5])(*paaaiVar39 + 1);
    }
    paaaiVar14 = (int (*) [8] [5] [5])((long)paaaiVar14 + 800);
    paaaiVar20 = (int (*) [8] [5] [5])((long)paaaiVar20 + 800);
    paaaiVar9 = paaaiVar9 + 1;
  }
  paaaaiVar42 = pvVar2->int21;
  paaaaiVar15 = int21_dH;
  paaaaiVar21 = int21_37;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    paiVar8 = (int (*) [5])paaaaiVar15;
    paiVar13 = (int (*) [5])paaaaiVar21;
    paaaaiVar43 = paaaaiVar42;
    for (lVar33 = 0; lVar33 != 8; lVar33 = lVar33 + 1) {
      paiVar19 = paiVar13;
      paiVar31 = paiVar8;
      paaaaiVar54 = paaaaiVar43;
      for (lVar28 = 0; lVar28 != 5; lVar28 = lVar28 + 1) {
        paaaaiVar29 = paaaaiVar54;
        paiVar35 = paiVar31;
        paiVar38 = paiVar19;
        for (lVar52 = 0; lVar52 != 5; lVar52 = lVar52 + 1) {
          for (lVar36 = 0; lVar36 != 5; lVar36 = lVar36 + 1) {
            iVar59 = (*(int (*) [5] [5] [5])*paiVar35)[0][0][lVar36];
            (*paaaaiVar29)[0][0][0][lVar36] =
                 (int)((double)iVar59 -
                      (double)(iVar59 - (*(int (*) [5] [5] [5])*paiVar38)[0][0][lVar36]) * dVar62);
          }
          paiVar35 = paiVar35 + 1;
          paiVar38 = paiVar38 + 1;
          paaaaiVar29 = (int (*) [8] [5] [5] [5])((*paaaaiVar29)[0][0] + 1);
        }
        paiVar31 = (int (*) [5])(*paiVar31 + 0x19);
        paiVar19 = (int (*) [5])(*paiVar19 + 0x19);
        paaaaiVar54 = (int (*) [8] [5] [5] [5])((*paaaaiVar54)[0] + 1);
      }
      paiVar8 = paiVar8 + 0x19;
      paiVar13 = paiVar13 + 0x19;
      paaaaiVar43 = (int (*) [8] [5] [5] [5])(*paaaaiVar43 + 1);
    }
    paaaaiVar15 = (int (*) [8] [5] [5] [5])((long)paaaaiVar15 + 4000);
    paaaaiVar21 = (int (*) [8] [5] [5] [5])((long)paaaaiVar21 + 4000);
    paaaaiVar42 = paaaaiVar42 + 1;
  }
  local_98 = pvVar2->int22;
  local_a0 = (int (*) [5])int22_dH;
  local_a8 = (int (*) [5])int22_37;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    paaaaaiVar16 = local_98;
    paiVar8 = local_a8;
    paiVar13 = local_a0;
    for (lVar33 = 0; lVar33 != 8; lVar33 = lVar33 + 1) {
      paaaaaiVar10 = paaaaaiVar16;
      paiVar19 = paiVar13;
      paiVar31 = paiVar8;
      for (lVar28 = 0; lVar28 != 5; lVar28 = lVar28 + 1) {
        paiVar35 = paiVar19;
        paaaaaiVar46 = paaaaaiVar10;
        paiVar38 = paiVar31;
        for (lVar52 = 0; lVar52 != 5; lVar52 = lVar52 + 1) {
          paaaaiVar51 = (int (*) [5] [5] [5] [5])paiVar38;
          paaaaiVar53 = (int (*) [5] [5] [5] [5])paiVar35;
          paaaaaiVar57 = paaaaaiVar46;
          for (lVar36 = 0; lVar36 != 5; lVar36 = lVar36 + 1) {
            for (lVar32 = 0; lVar32 != 5; lVar32 = lVar32 + 1) {
              iVar59 = (*(int (*) [5] [5] [5] [5])*(int (*) [5])paaaaiVar53)[0][0][0][lVar32];
              (*paaaaaiVar57)[0][0][0][0][lVar32] =
                   (int)((double)iVar59 -
                        (double)(iVar59 - (*(int (*) [5] [5] [5] [5])*(int (*) [5])paaaaiVar51)[0]
                                          [0][0][lVar32]) * dVar62);
            }
            paaaaiVar53 = (int (*) [5] [5] [5] [5])((long)paaaaiVar53 + 0x14);
            paaaaiVar51 = (int (*) [5] [5] [5] [5])((long)paaaaiVar51 + 0x14);
            paaaaaiVar57 = (int (*) [8] [5] [5] [5] [5])((*paaaaaiVar57)[0][0][0] + 1);
          }
          paiVar35 = (int (*) [5])(*paiVar35 + 0x19);
          paiVar38 = (int (*) [5])(*paiVar38 + 0x19);
          paaaaaiVar46 = (int (*) [8] [5] [5] [5] [5])((*paaaaaiVar46)[0][0] + 1);
        }
        paiVar19 = paiVar19 + 0x19;
        paiVar31 = paiVar31 + 0x19;
        paaaaaiVar10 = (int (*) [8] [5] [5] [5] [5])((*paaaaaiVar10)[0] + 1);
      }
      paiVar13 = paiVar13 + 0x7d;
      paiVar8 = paiVar8 + 0x7d;
      paaaaaiVar16 = (int (*) [8] [5] [5] [5] [5])(*paaaaaiVar16 + 1);
    }
    local_a0 = local_a0 + 1000;
    local_a8 = local_a8 + 1000;
    local_98 = local_98 + 1;
  }
  strncpy(pvVar2->Tetraloops,Tetraloops,0x119);
  strncpy(pvVar2->Triloops,Triloops,0xf1);
  strncpy(pvVar2->Hexaloops,Hexaloops,0x169);
  id = id + 1;
  pvVar2->id = id;
  return pvVar2;
}

Assistant:

PRIVATE vrna_param_t *
get_scaled_params(vrna_md_t *md)
{
  unsigned int  i, j, k, l;
  double        tempf;
  vrna_param_t  *params;

  params = (vrna_param_t *)vrna_alloc(sizeof(vrna_param_t));

  memset(params->param_file, '\0', 256);
  if (last_parameter_file() != NULL)
    strncpy(params->param_file, last_parameter_file(), 255);

  params->model_details = *md;  /* copy over the model details */
  params->temperature   = md->temperature;
  tempf                 = ((params->temperature + K0) / Tmeasure);

  params->ninio[2]              = RESCALE_dG(ninio37, niniodH, tempf);
  params->lxc                   = lxc37 * tempf;
  params->TripleC               = RESCALE_dG(TripleC37, TripleCdH, tempf);
  params->MultipleCA            = RESCALE_dG(MultipleCA37, MultipleCAdH, tempf);
  params->MultipleCB            = RESCALE_dG(MultipleCB37, MultipleCBdH, tempf);
  params->TerminalAU            = RESCALE_dG(TerminalAU37, TerminalAUdH, tempf);
  params->DuplexInit            = RESCALE_dG(DuplexInit37, DuplexInitdH, tempf);
  params->MLbase                = RESCALE_dG(ML_BASE37, ML_BASEdH, tempf);
  // Pseudoknot -- added by Mateo 2/14/23
  params->PS_penalty            = -138;
  params->PSM_penalty           = 1007; 
  params->PSP_penalty           = 1500; 
  params->PB_penalty            = 246; 
  params->PUP_penalty           = 6; 
  params->PPS_penalty           = 96; 
  params->e_stP_penalty         = .89; 
  params->e_intP_penalty        = .74;
  params->ap_penalty            = 341;
  params->bp_penalty            = 56;
  params->cp_penalty            = 12;
  params->a_penalty            = 339; // Fix later
  params->b_penalty            = 3;
  params->c_penalty            = 2;
  //
  params->MLclosing             = RESCALE_dG(ML_closing37, ML_closingdH, tempf);
  params->gquadLayerMismatch    = RESCALE_dG(GQuadLayerMismatch37, GQuadLayerMismatchH, tempf);
  params->gquadLayerMismatchMax = GQuadLayerMismatchMax;

  for (i = VRNA_GQUAD_MIN_STACK_SIZE; i <= VRNA_GQUAD_MAX_STACK_SIZE; i++)
    for (j = 3 * VRNA_GQUAD_MIN_LINKER_LENGTH; j <= 3 * VRNA_GQUAD_MAX_LINKER_LENGTH; j++) {
      double  GQuadAlpha_T  = RESCALE_dG(GQuadAlpha37, GQuadAlphadH, tempf);
      double  GQuadBeta_T   = RESCALE_dG(GQuadBeta37, GQuadBetadH, tempf);
      params->gquad[i][j] = (int)GQuadAlpha_T * (i - 1) + (int)(((double)GQuadBeta_T) * log(j - 2));
    }

  for (i = 0; i < 31; i++)
    params->hairpin[i] = RESCALE_dG(hairpin37[i], hairpindH[i], tempf);

  for (i = 0; i <= MIN2(30, MAXLOOP); i++) {
    params->bulge[i]          = RESCALE_dG(bulge37[i], bulgedH[i], tempf);
    params->internal_loop[i]  = RESCALE_dG(internal_loop37[i], internal_loopdH[i], tempf);
  }

  for (; i <= MAXLOOP; i++) {
    params->bulge[i] = params->bulge[30] +
                       (int)(params->lxc * log((double)(i) / 30.));
    params->internal_loop[i] = params->internal_loop[30] +
                               (int)(params->lxc * log((double)(i) / 30.));
  }

  for (i = 0; (i * 7) < strlen(Tetraloops); i++)
    params->Tetraloop_E[i] = RESCALE_dG(Tetraloop37[i], TetraloopdH[i], tempf);

  for (i = 0; (i * 5) < strlen(Triloops); i++)
    params->Triloop_E[i] = RESCALE_dG(Triloop37[i], TriloopdH[i], tempf);

  for (i = 0; (i * 9) < strlen(Hexaloops); i++)
    params->Hexaloop_E[i] = RESCALE_dG(Hexaloop37[i], HexaloopdH[i], tempf);

  for (i = 0; i <= NBPAIRS; i++)
    params->MLintern[i] = RESCALE_dG(ML_intern37, ML_interndH, tempf);

  /* stacks    G(T) = H - [H - G(T0)]*T/T0 */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      params->stack[i][j] = RESCALE_dG(stack37[i][j],
                                       stackdH[i][j],
                                       tempf);

  /* mismatches */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j < 5; j++)
      for (k = 0; k < 5; k++) {
        int mm;
        params->mismatchI[i][j][k] = RESCALE_dG(mismatchI37[i][j][k],
                                                mismatchIdH[i][j][k],
                                                tempf);
        params->mismatchH[i][j][k] = RESCALE_dG(mismatchH37[i][j][k],
                                                mismatchHdH[i][j][k],
                                                tempf);
        params->mismatch1nI[i][j][k] = RESCALE_dG(mismatch1nI37[i][j][k],
                                                  mismatch1nIdH[i][j][k],
                                                  tempf);
        params->mismatch23I[i][j][k] = RESCALE_dG(mismatch23I37[i][j][k],
                                                  mismatch23IdH[i][j][k],
                                                  tempf);
        if (md->dangles) {
          mm = RESCALE_dG(mismatchM37[i][j][k],
                          mismatchMdH[i][j][k],
                          tempf);
          params->mismatchM[i][j][k]  = (mm > 0) ? 0 : mm;
          mm                          = RESCALE_dG(mismatchExt37[i][j][k],
                                                   mismatchExtdH[i][j][k],
                                                   tempf);
          params->mismatchExt[i][j][k] = (mm > 0) ? 0 : mm;
        } else {
          params->mismatchM[i][j][k] = params->mismatchExt[i][j][k] = 0;
        }
      }

  /* dangles */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j < 5; j++) {
      int dd;
      dd = RESCALE_dG(dangle5_37[i][j],
                      dangle5_dH[i][j],
                      tempf);
      params->dangle5[i][j] = (dd > 0) ? 0 : dd;  /* must be <= 0 */
      dd                    = RESCALE_dG(dangle3_37[i][j],
                                         dangle3_dH[i][j],
                                         tempf);
      params->dangle3[i][j] = (dd > 0) ? 0 : dd;  /* must be <= 0 */
    }

  /* interior 1x1 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++)
          params->int11[i][j][k][l] = RESCALE_dG(int11_37[i][j][k][l],
                                                 int11_dH[i][j][k][l],
                                                 tempf);

  /* interior 2x1 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m;
          for (m = 0; m < 5; m++)
            params->int21[i][j][k][l][m] = RESCALE_dG(int21_37[i][j][k][l][m],
                                                      int21_dH[i][j][k][l][m],
                                                      tempf);
        }

  /* interior 2x2 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m, n;
          for (m = 0; m < 5; m++)
            for (n = 0; n < 5; n++)
              params->int22[i][j][k][l][m][n] = RESCALE_dG(int22_37[i][j][k][l][m][n],
                                                           int22_dH[i][j][k][l][m][n],
                                                           tempf);
        }

  strncpy(params->Tetraloops, Tetraloops, 281);
  strncpy(params->Triloops, Triloops, 241);
  strncpy(params->Hexaloops, Hexaloops, 361);

  params->id = ++id;
  return params;
}